

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if.c
# Opt level: O1

int spi_read(uint handle,char *buf,uint count)

{
  int sent;
  
  sent = pigpio_command(gPigCommand,0x49,handle,count,0);
  if (0 < sent) {
    sent = recvMax(buf,count,sent);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&command_mutex);
  return sent;
}

Assistant:

int spi_read(unsigned handle, char *buf, unsigned count)
{
   int bytes;

   bytes = pigpio_command
      (gPigCommand, PI_CMD_SPIR, handle, count, 0);

   if (bytes > 0)
   {
      bytes = recvMax(buf, count, bytes);
   }

   pthread_mutex_unlock(&command_mutex);

   return bytes;
}